

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_update(mbedtls_hmac_drbg_context *ctx,uchar *additional,size_t add_len)

{
  byte bVar1;
  int local_5c;
  uchar local_58 [4];
  int ret;
  uchar K [32];
  byte local_2a;
  byte local_29;
  uchar sep [1];
  ulong uStack_28;
  uchar rounds;
  size_t md_len;
  size_t add_len_local;
  uchar *additional_local;
  mbedtls_hmac_drbg_context *ctx_local;
  
  bVar1 = mbedtls_md_get_size((ctx->md_ctx).md_info);
  uStack_28 = (ulong)bVar1;
  local_29 = 1;
  if (additional != (uchar *)0x0 && add_len != 0) {
    local_29 = 2;
  }
  local_5c = -0x5100;
  local_2a = 0;
  while (((((local_2a < local_29 && (local_5c = mbedtls_md_hmac_reset(&ctx->md_ctx), local_5c == 0))
           && (local_5c = mbedtls_md_hmac_update(&ctx->md_ctx,ctx->V,uStack_28), local_5c == 0)) &&
          (local_5c = mbedtls_md_hmac_update(&ctx->md_ctx,&local_2a,1), local_5c == 0)) &&
         ((((local_29 != 2 ||
            (local_5c = mbedtls_md_hmac_update(&ctx->md_ctx,additional,add_len), local_5c == 0)) &&
           ((local_5c = mbedtls_md_hmac_finish(&ctx->md_ctx,local_58), local_5c == 0 &&
            ((local_5c = mbedtls_md_hmac_starts(&ctx->md_ctx,local_58,uStack_28), local_5c == 0 &&
             (local_5c = mbedtls_md_hmac_update(&ctx->md_ctx,ctx->V,uStack_28), local_5c == 0))))))
          && (local_5c = mbedtls_md_hmac_finish(&ctx->md_ctx,ctx->V), local_5c == 0))))) {
    local_2a = local_2a + 1;
  }
  mbedtls_platform_zeroize(local_58,0x20);
  return local_5c;
}

Assistant:

int mbedtls_hmac_drbg_update(mbedtls_hmac_drbg_context *ctx,
                             const unsigned char *additional,
                             size_t add_len)
{
    size_t md_len = mbedtls_md_get_size(ctx->md_ctx.md_info);
    unsigned char rounds = (additional != NULL && add_len != 0) ? 2 : 1;
    unsigned char sep[1];
    unsigned char K[MBEDTLS_MD_MAX_SIZE];
    int ret = MBEDTLS_ERR_MD_BAD_INPUT_DATA;

    for (sep[0] = 0; sep[0] < rounds; sep[0]++) {
        /* Step 1 or 4 */
        if ((ret = mbedtls_md_hmac_reset(&ctx->md_ctx)) != 0) {
            goto exit;
        }
        if ((ret = mbedtls_md_hmac_update(&ctx->md_ctx,
                                          ctx->V, md_len)) != 0) {
            goto exit;
        }
        if ((ret = mbedtls_md_hmac_update(&ctx->md_ctx,
                                          sep, 1)) != 0) {
            goto exit;
        }
        if (rounds == 2) {
            if ((ret = mbedtls_md_hmac_update(&ctx->md_ctx,
                                              additional, add_len)) != 0) {
                goto exit;
            }
        }
        if ((ret = mbedtls_md_hmac_finish(&ctx->md_ctx, K)) != 0) {
            goto exit;
        }

        /* Step 2 or 5 */
        if ((ret = mbedtls_md_hmac_starts(&ctx->md_ctx, K, md_len)) != 0) {
            goto exit;
        }
        if ((ret = mbedtls_md_hmac_update(&ctx->md_ctx,
                                          ctx->V, md_len)) != 0) {
            goto exit;
        }
        if ((ret = mbedtls_md_hmac_finish(&ctx->md_ctx, ctx->V)) != 0) {
            goto exit;
        }
    }

exit:
    mbedtls_platform_zeroize(K, sizeof(K));
    return ret;
}